

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# w3interp.cpp
# Opt level: O2

void __thiscall w3Interp::Max_f64(w3Interp *this)

{
  double *pdVar1;
  double dVar2;
  
  dVar2 = w3Stack::pop_f64(&this->super_w3Stack);
  pdVar1 = w3Stack::f64(&this->super_w3Stack);
  if (dVar2 <= *pdVar1) {
    dVar2 = *pdVar1;
  }
  *pdVar1 = dVar2;
  return;
}

Assistant:

INTERP (Max_f64)
{
    const double z2 = pop_f64 ();
    double& z1 = f64 ();
    z1 = std::max (z1, z2);
}